

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_playground.cpp
# Opt level: O2

int main1(void)

{
  MyClass *this;
  ostream *poVar1;
  shared_ptr_t<MyClass> mc1;
  shared_ptr_t<MyClass> mc2;
  
  std::operator<<((ostream *)&std::cerr,"--- shared_ptr playground 1 ---\n");
  mc1.ptr_ = (MyClass *)0x0;
  mc1.control_block_ptr_ = (control_block *)0x0;
  this = (MyClass *)operator_new(4);
  MyClass::MyClass(this);
  estl::shared_ptr<MyClass>::shared_ptr(&mc2,this);
  (mc2.ptr_)->val_ = 0xc;
  estl::shared_ptr<MyClass>::operator=(&mc1,&mc2);
  poVar1 = std::operator<<((ostream *)&std::cerr,"mc1.get() : ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1,"mc1.use_count():");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," \n");
  estl::shared_ptr<MyClass>::~shared_ptr(&mc2);
  std::operator<<((ostream *)&std::cerr,"--- shared_ptr playground 2 ---\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"mc1.get() : ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1,"mc1.use_count():");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," \n");
  if (mc1.ptr_ != (MyClass *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"mc1->val(): ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(mc1.ptr_)->val_);
    std::operator<<(poVar1,"\n");
  }
  std::operator<<((ostream *)&std::cerr,"--- shared_ptr playground 3: mc1 ---\n");
  estl::shared_ptr<MyClass>::~shared_ptr(&mc1);
  return 0;
}

Assistant:

int main1()
{
    cerr << "--- shared_ptr playground 1 ---\n";
    shared_ptr_t<MyClass> mc1;
    {
        shared_ptr_t<MyClass> mc2 = shared_ptr_t<MyClass>(new MyClass());
        mc2->val(12);
        mc1 = mc2;
        cerr << "mc1.get() : " << mc1.get() << "mc1.use_count():" << mc1.use_count() << " \n";
    }
    cerr << "--- shared_ptr playground 2 ---\n";

    cerr << "mc1.get() : " << mc1.get() << "mc1.use_count():" << mc1.use_count() << " \n";

    if (mc1) {
        cerr << "mc1->val(): " << mc1->val() << "\n";
    }

    cerr << "--- shared_ptr playground 3: mc1 ---\n";

    return 0;
}